

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O0

u32 __thiscall
irr::scene::COBJMeshFileLoader::copyWord
          (COBJMeshFileLoader *this,c8 *outBuf,c8 *inBuf,u32 outBufLength,c8 *bufEnd)

{
  uint uVar1;
  uint *puVar2;
  int in_ECX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  undefined1 *in_RSI;
  long in_R8;
  u32 j;
  u32 length;
  u32 i;
  uint local_40;
  uint local_3c [2];
  uint local_34;
  long local_30;
  int local_24;
  long local_20;
  undefined1 *local_18;
  uint local_4;
  
  local_20 = CONCAT71(in_register_00000011,in_DL);
  if (in_ECX == 0) {
    local_4 = 0;
  }
  else if (local_20 == 0) {
    *in_RSI = 0;
    local_4 = 0;
  }
  else {
    local_34 = 0;
    local_30 = in_R8;
    local_24 = in_ECX;
    local_18 = in_RSI;
    while (((*(char *)(local_20 + (ulong)local_34) != '\0' &&
            (uVar1 = core::isspace((int)*(char *)(local_20 + (ulong)local_34)), (uVar1 & 1) == 0))
           && (local_20 + (ulong)local_34 != local_30))) {
      local_34 = local_34 + 1;
    }
    local_3c[0] = local_24 - 1;
    puVar2 = core::min_<unsigned_int>(&local_34,local_3c);
    local_4 = *puVar2;
    for (local_40 = 0; local_40 < local_4; local_40 = local_40 + 1) {
      local_18[local_40] = *(undefined1 *)(local_20 + (ulong)local_40);
    }
    local_18[local_4] = 0;
  }
  return local_4;
}

Assistant:

u32 COBJMeshFileLoader::copyWord(c8 *outBuf, const c8 *const inBuf, u32 outBufLength, const c8 *const bufEnd)
{
	if (!outBufLength)
		return 0;
	if (!inBuf) {
		*outBuf = 0;
		return 0;
	}

	u32 i = 0;
	while (inBuf[i]) {
		if (core::isspace(inBuf[i]) || &(inBuf[i]) == bufEnd)
			break;
		++i;
	}

	u32 length = core::min_(i, outBufLength - 1);
	for (u32 j = 0; j < length; ++j)
		outBuf[j] = inBuf[j];

	outBuf[length] = 0;
	return length;
}